

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O1

void __thiscall
duckdb::Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::Value,true>>
          (Serializer *this,field_id_t field_id,char *tag,vector<duckdb::Value,_true> *value,
          vector<duckdb::Value,_true> *default_value)

{
  Value *pVVar1;
  byte bVar2;
  Value *this_00;
  Value *rhs;
  bool bVar3;
  
  if ((this->options).serialize_default_values == false) {
    this_00 = (value->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_start;
    pVVar1 = (value->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_finish;
    rhs = (default_value->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_start;
    if ((long)pVVar1 - (long)this_00 ==
        (long)(default_value->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)rhs) {
      bVar3 = this_00 == pVVar1;
      if (bVar3) {
LAB_01786ded:
        if (bVar3) {
          bVar2 = 0;
          (*this->_vptr_Serializer[4])(this,(ulong)field_id,tag,0);
          goto LAB_01786e2a;
        }
      }
      else {
        bVar3 = Value::operator==(this_00,rhs);
        if (bVar3) {
          do {
            rhs = rhs + 1;
            this_00 = this_00 + 1;
            bVar3 = this_00 == pVVar1;
            if (bVar3) goto LAB_01786ded;
            bVar3 = Value::operator==(this_00,rhs);
          } while (bVar3);
        }
      }
    }
  }
  (*this->_vptr_Serializer[4])(this,(ulong)field_id,tag,1);
  WriteValue<duckdb::Value>(this,value);
  bVar2 = 1;
LAB_01786e2a:
  (*this->_vptr_Serializer[5])(this,(ulong)bVar2);
  return;
}

Assistant:

void WritePropertyWithDefault(const field_id_t field_id, const char *tag, const T &value, const T &default_value) {
		// If current value is default, don't write it
		if (!options.serialize_default_values && (value == default_value)) {
			OnOptionalPropertyBegin(field_id, tag, false);
			OnOptionalPropertyEnd(false);
			return;
		}
		OnOptionalPropertyBegin(field_id, tag, true);
		WriteValue(value);
		OnOptionalPropertyEnd(true);
	}